

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld,int *aChange,
                     int bChngRowid)

{
  Lookaside *pLVar1;
  u8 uVar2;
  sqlite3 *db;
  Column *pCVar3;
  char *z;
  undefined1 uVar4;
  u16 uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  FKey *p;
  sColMap *psVar9;
  Expr *pEVar10;
  Expr *pEVar11;
  Expr *pRight;
  ExprList *pEList;
  SrcList *pSrc;
  Trigger *p_00;
  Schema *pSVar12;
  Select *pSVar13;
  i16 *piVar14;
  long lVar15;
  long lVar16;
  TriggerStep *pTVar17;
  long lVar18;
  bool bVar19;
  Expr *local_108;
  Select *local_f8;
  Expr *local_f0;
  ExprList *local_d0;
  int *aiCol;
  int local_ac;
  Token tNew;
  Index *pIdx;
  Token tOld;
  Token tFromCol;
  Token tToCol;
  
  if ((pParse->db->flags & 0x4000) != 0) {
    local_ac = regOld;
    p = sqlite3FkReferences(pTab);
    bVar19 = pChanges != (ExprList *)0x0;
    for (; p != (FKey *)0x0; p = p->pNextTo) {
      if ((aChange == (int *)0x0) ||
         (iVar6 = fkParentIsModified(pTab,p,aChange,bChngRowid), iVar6 != 0)) {
        db = pParse->db;
        uVar2 = p->aAction[bVar19];
        if ((uVar2 != '\a') || ((db->flags & 0x80000) == 0)) {
          p_00 = p->apTrigger[bVar19];
          if ((uVar2 == '\0') || (p_00 != (Trigger *)0x0)) {
            if (p_00 != (Trigger *)0x0) {
LAB_001b3205:
              sqlite3CodeRowTriggerDirect(pParse,p_00,pTab,local_ac,2,0);
            }
          }
          else {
            pIdx = (Index *)0x0;
            aiCol = (int *)0x0;
            iVar6 = sqlite3FkLocateIndex(pParse,pTab,p,&pIdx,&aiCol);
            if (iVar6 == 0) {
              lVar16 = 0;
              lVar18 = 0;
              local_f0 = (Expr *)0x0;
              local_d0 = (ExprList *)0x0;
              local_108 = (Expr *)0x0;
              for (lVar15 = 0; lVar15 < p->nCol; lVar15 = lVar15 + 1) {
                tOld.z = "old";
                tOld.n = 3;
                tOld._12_4_ = 0;
                psVar9 = (sColMap *)((long)aiCol + lVar16);
                if (aiCol == (int *)0x0) {
                  psVar9 = p->aCol;
                }
                tNew.z = "new";
                tNew.n = 3;
                tNew._12_4_ = 0;
                piVar14 = &pTab->iPKey;
                if (pIdx != (Index *)0x0) {
                  piVar14 = (i16 *)((long)pIdx->aiColumn + lVar18);
                }
                iVar6 = psVar9->iFrom;
                tToCol.z = pTab->aCol[*piVar14].zCnName;
                tToCol.n = sqlite3Strlen30(tToCol.z);
                tFromCol.z = p->pFrom->aCol[iVar6].zCnName;
                tFromCol.n = sqlite3Strlen30(tFromCol.z);
                pEVar10 = sqlite3ExprAlloc(db,0x3b,&tOld,0);
                pEVar11 = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                pEVar10 = sqlite3PExpr(pParse,0x8d,pEVar10,pEVar11);
                pEVar11 = sqlite3ExprAlloc(db,0x3b,&tFromCol,0);
                pEVar10 = sqlite3PExpr(pParse,0x35,pEVar10,pEVar11);
                local_f0 = sqlite3ExprAnd(pParse,local_f0,pEVar10);
                if (pChanges != (ExprList *)0x0) {
                  pEVar10 = sqlite3ExprAlloc(db,0x3b,&tOld,0);
                  pEVar11 = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                  pEVar10 = sqlite3PExpr(pParse,0x8d,pEVar10,pEVar11);
                  pEVar11 = sqlite3ExprAlloc(db,0x3b,&tNew,0);
                  pRight = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                  pEVar11 = sqlite3PExpr(pParse,0x8d,pEVar11,pRight);
                  pEVar10 = sqlite3PExpr(pParse,0x2d,pEVar10,pEVar11);
                  local_108 = sqlite3ExprAnd(pParse,local_108,pEVar10);
                }
                if ((uVar2 != '\n' || pChanges != (ExprList *)0x0) && uVar2 != '\a') {
                  if (uVar2 == '\t') {
                    pCVar3 = p->pFrom->aCol;
                    if (((pCVar3[iVar6].colFlags & 0x60) != 0) ||
                       (pEVar10 = sqlite3ColumnExpr(p->pFrom,pCVar3 + iVar6), pEVar10 == (Expr *)0x0
                       )) goto LAB_001b2eee;
                    pEVar10 = sqlite3ExprDup(db,pEVar10,0);
                  }
                  else if (uVar2 == '\n') {
                    pEVar10 = sqlite3ExprAlloc(db,0x3b,&tNew,0);
                    pEVar11 = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                    pEVar10 = sqlite3PExpr(pParse,0x8d,pEVar10,pEVar11);
                  }
                  else {
LAB_001b2eee:
                    pEVar10 = sqlite3ExprAlloc(db,0x79,(Token *)0x0,0);
                  }
                  local_d0 = sqlite3ExprListAppend(pParse,local_d0,pEVar10);
                  sqlite3ExprListSetName(pParse,local_d0,&tFromCol,0);
                }
                lVar18 = lVar18 + 2;
                lVar16 = lVar16 + 4;
              }
              sqlite3DbFree(db,aiCol);
              z = p->pFrom->zName;
              uVar7 = sqlite3Strlen30(z);
              if (uVar2 == '\a') {
                iVar6 = sqlite3SchemaToIndex(db,pTab->pSchema);
                tOld.n = uVar7;
                tNew.z = db->aDb[iVar6].zDbSName;
                tOld.z = z;
                uVar8 = sqlite3Strlen30(tNew.z);
                tNew.n = uVar8;
                pEVar10 = sqlite3Expr(db,0x47,"FOREIGN KEY constraint failed");
                if (pEVar10 != (Expr *)0x0) {
                  pEVar10->affExpr = '\x02';
                }
                pEList = sqlite3ExprListAppendNew(pParse->db,pEVar10);
                pSrc = sqlite3SrcListAppend(pParse,(SrcList *)0x0,&tNew,&tOld);
                local_f8 = sqlite3SelectNew(pParse,pEList,pSrc,local_f0,(ExprList *)0x0,(Expr *)0x0,
                                            (ExprList *)0x0,0,(Expr *)0x0);
                local_f0 = (Expr *)0x0;
              }
              else {
                local_f8 = (Select *)0x0;
              }
              (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
              (db->lookaside).sz = 0;
              p_00 = (Trigger *)sqlite3DbMallocZero(db,(ulong)uVar7 + 0xa9);
              if (p_00 == (Trigger *)0x0) {
                pTVar17 = (TriggerStep *)0x0;
              }
              else {
                pTVar17 = (TriggerStep *)(p_00 + 1);
                p_00->step_list = pTVar17;
                p_00[1].pWhen = (Expr *)&p_00[2].pWhen;
                memcpy(&p_00[2].pWhen,z,(ulong)uVar7);
                pSVar12 = (Schema *)sqlite3ExprDup(db,local_f0,1);
                p_00[1].pSchema = pSVar12;
                pSVar12 = (Schema *)sqlite3ExprListDup(db,local_d0,1);
                p_00[1].pTabSchema = pSVar12;
                pSVar13 = sqlite3SelectDup(db,local_f8,1);
                *(Select **)&p_00[1].op = pSVar13;
                if (local_108 == (Expr *)0x0) {
                  local_108 = (Expr *)0x0;
                }
                else {
                  local_108 = sqlite3PExpr(pParse,0x13,local_108,(Expr *)0x0);
                  pEVar10 = sqlite3ExprDup(db,local_108,1);
                  p_00->pWhen = pEVar10;
                }
              }
              pLVar1 = &db->lookaside;
              pLVar1->bDisable = pLVar1->bDisable - 1;
              if (pLVar1->bDisable == 0) {
                uVar5 = (db->lookaside).szTrue;
              }
              else {
                uVar5 = 0;
              }
              (db->lookaside).sz = uVar5;
              sqlite3ExprDelete(db,local_f0);
              sqlite3ExprDelete(db,local_108);
              sqlite3ExprListDelete(db,local_d0);
              sqlite3SelectDelete(db,local_f8);
              if (db->mallocFailed != '\x01') {
                if (uVar2 == '\a') {
                  uVar4 = 0x8a;
                }
                else if ((uVar2 == '\n') && (pChanges == (ExprList *)0x0)) {
                  uVar4 = 0x80;
                }
                else {
                  uVar4 = 0x81;
                }
                pTVar17->op = uVar4;
                pTVar17->pTrig = p_00;
                pSVar12 = pTab->pSchema;
                p_00->pSchema = pSVar12;
                p_00->pTabSchema = pSVar12;
                p->apTrigger[bVar19] = p_00;
                p_00->op = bVar19 | 0x80;
                goto LAB_001b3205;
              }
              fkTriggerDelete(db,p_00);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld,                     /* Address of array containing old row */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  /* If foreign-key support is enabled, iterate through all FKs that
  ** refer to table pTab. If there is an action associated with the FK
  ** for this operation (either update or delete), invoke the associated
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      if( aChange==0 || fkParentIsModified(pTab, pFKey, aChange, bChngRowid) ){
        Trigger *pAct = fkActionTrigger(pParse, pTab, pFKey, pChanges);
        if( pAct ){
          sqlite3CodeRowTriggerDirect(pParse, pAct, pTab, regOld, OE_Abort, 0);
        }
      }
    }
  }
}